

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O1

String * __thiscall
String::format<2ul>(String *__return_storage_ptr__,String *this,char *format,__va_list_tag *args)

{
  uint uVar1;
  char buffer [2];
  va_list copy;
  char local_3a [2];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_28 = *(undefined8 *)(format + 0x10);
  local_38 = *(undefined8 *)format;
  uStack_30 = *(undefined8 *)(format + 8);
  uVar1 = vsnprintf(local_3a,2,(char *)this,format);
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  if (uVar1 < 2) {
    assign(__return_storage_ptr__,local_3a,(long)(int)uVar1);
  }
  else {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar1);
    vsnprintf((__return_storage_ptr__->mString)._M_dataplus._M_p,(long)(int)uVar1 + 1,(char *)this,
              &local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static String format(const char *format, va_list args)
    {
        va_list copy;
        va_copy(copy, args);

        char buffer[StaticBufSize];
        const size_t size = ::vsnprintf(buffer, StaticBufSize, format, args);
        assert(size >= 0);
        String ret;
        if (size < StaticBufSize) {
            ret.assign(buffer, size);
        } else {
            ret.resize(size);
            ::vsnprintf(&ret[0], size+1, format, copy);
        }
        va_end(copy);
        return ret;
    }